

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void __thiscall
VmaPool_T::VmaPool_T
          (VmaPool_T *this,VmaAllocator hAllocator,VmaPoolCreateInfo *createInfo,
          VkDeviceSize preferredBlockSize)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  VkDeviceSize VVar4;
  VkDeviceSize VVar5;
  void *pvVar6;
  size_t sVar7;
  size_t sVar8;
  VkAllocationCallbacks *pVVar9;
  ulong uVar10;
  VkDeviceSize VVar11;
  
  uVar2 = createInfo->memoryTypeIndex;
  uVar3 = createInfo->flags;
  VVar4 = createInfo->blockSize;
  sVar7 = createInfo->minBlockCount;
  sVar8 = createInfo->maxBlockCount;
  VVar11 = 1;
  if ((uVar3 & 2) == 0) {
    VVar11 = (hAllocator->m_PhysicalDeviceProperties).limits.bufferImageGranularity;
    VVar11 = VVar11 + (VVar11 == 0);
  }
  VVar5 = (hAllocator->m_PhysicalDeviceProperties).limits.nonCoherentAtomSize;
  uVar10 = 1;
  if (((hAllocator->m_MemProps).memoryTypes[uVar2].propertyFlags & 6) == 2) {
    uVar10 = VVar5 + (VVar5 == 0);
  }
  if (uVar10 <= createInfo->minAllocationAlignment) {
    uVar10 = createInfo->minAllocationAlignment;
  }
  if (VVar4 != 0) {
    preferredBlockSize = VVar4;
  }
  fVar1 = createInfo->priority;
  pvVar6 = createInfo->pMemoryAllocateNext;
  (this->m_BlockVector).m_hAllocator = hAllocator;
  (this->m_BlockVector).m_hParentPool = this;
  (this->m_BlockVector).m_MemoryTypeIndex = uVar2;
  (this->m_BlockVector).m_PreferredBlockSize = preferredBlockSize;
  (this->m_BlockVector).m_MinBlockCount = sVar7;
  (this->m_BlockVector).m_MaxBlockCount = sVar8;
  (this->m_BlockVector).m_BufferImageGranularity = VVar11;
  (this->m_BlockVector).m_ExplicitBlockSize = VVar4 != 0;
  (this->m_BlockVector).m_Algorithm = uVar3 & 4;
  (this->m_BlockVector).m_Priority = fVar1;
  (this->m_BlockVector).m_MinAllocationAlignment = uVar10;
  (this->m_BlockVector).m_pMemoryAllocateNext = pvVar6;
  (this->m_BlockVector).m_Mutex.m_Mutex._M_impl._M_rwlock.__align = 0;
  *(undefined8 *)((long)&(this->m_BlockVector).m_Mutex.m_Mutex._M_impl._M_rwlock + 8) = 0;
  *(undefined8 *)((long)&(this->m_BlockVector).m_Mutex.m_Mutex._M_impl._M_rwlock + 0x10) = 0;
  *(undefined8 *)((long)&(this->m_BlockVector).m_Mutex.m_Mutex._M_impl._M_rwlock + 0x18) = 0;
  *(undefined8 *)((long)&(this->m_BlockVector).m_Mutex.m_Mutex._M_impl._M_rwlock + 0x20) = 0;
  (this->m_BlockVector).m_Mutex.m_Mutex._M_impl._M_rwlock.__data.__pad2 = 0;
  *(undefined8 *)((long)&(this->m_BlockVector).m_Mutex.m_Mutex._M_impl._M_rwlock + 0x30) = 0;
  pVVar9 = (VkAllocationCallbacks *)0x0;
  if (hAllocator->m_AllocationCallbacksSpecified != false) {
    pVVar9 = &hAllocator->m_AllocationCallbacks;
  }
  (this->m_BlockVector).m_Blocks.m_Allocator.m_pCallbacks = pVVar9;
  (this->m_BlockVector).m_Blocks.m_pArray = (VmaDeviceMemoryBlock **)0x0;
  (this->m_BlockVector).m_Blocks.m_Count = 0;
  *(undefined8 *)((long)&(this->m_BlockVector).m_Blocks.m_Count + 4) = 0;
  *(undefined8 *)((long)&(this->m_BlockVector).m_Blocks.m_Capacity + 4) = 0;
  (this->m_BlockVector).m_IncrementalSort = true;
  (this->m_DedicatedAllocations).m_UseMutex = true;
  (this->m_DedicatedAllocations).m_Mutex.m_Mutex._M_impl._M_rwlock.__align = 0;
  *(undefined8 *)((long)&(this->m_DedicatedAllocations).m_Mutex.m_Mutex._M_impl._M_rwlock + 8) = 0;
  *(undefined8 *)((long)&(this->m_DedicatedAllocations).m_Mutex.m_Mutex._M_impl._M_rwlock + 0x10) =
       0;
  *(undefined8 *)((long)&(this->m_DedicatedAllocations).m_Mutex.m_Mutex._M_impl._M_rwlock + 0x18) =
       0;
  *(undefined8 *)((long)&(this->m_DedicatedAllocations).m_Mutex.m_Mutex._M_impl._M_rwlock + 0x20) =
       0;
  (this->m_DedicatedAllocations).m_Mutex.m_Mutex._M_impl._M_rwlock.__data.__pad2 = 0;
  *(undefined8 *)((long)&(this->m_DedicatedAllocations).m_Mutex.m_Mutex._M_impl._M_rwlock + 0x30) =
       0;
  (this->m_DedicatedAllocations).m_AllocationList.m_Front = (ItemType *)0x0;
  (this->m_DedicatedAllocations).m_AllocationList.m_Back = (ItemType *)0x0;
  (this->m_DedicatedAllocations).m_AllocationList.m_Count = 0;
  this->m_Id = 0;
  this->m_Name = (char *)0x0;
  this->m_PrevPool = (VmaPool_T *)0x0;
  this->m_NextPool = (VmaPool_T *)0x0;
  return;
}

Assistant:

VmaPool_T::VmaPool_T(
    VmaAllocator hAllocator,
    const VmaPoolCreateInfo& createInfo,
    VkDeviceSize preferredBlockSize)
    : m_BlockVector(
        hAllocator,
        this, // hParentPool
        createInfo.memoryTypeIndex,
        createInfo.blockSize != 0 ? createInfo.blockSize : preferredBlockSize,
        createInfo.minBlockCount,
        createInfo.maxBlockCount,
        (createInfo.flags& VMA_POOL_CREATE_IGNORE_BUFFER_IMAGE_GRANULARITY_BIT) != 0 ? 1 : hAllocator->GetBufferImageGranularity(),
        createInfo.blockSize != 0, // explicitBlockSize
        createInfo.flags & VMA_POOL_CREATE_ALGORITHM_MASK, // algorithm
        createInfo.priority,
        VMA_MAX(hAllocator->GetMemoryTypeMinAlignment(createInfo.memoryTypeIndex), createInfo.minAllocationAlignment),
        createInfo.pMemoryAllocateNext),
    m_Id(0),
    m_Name(VMA_NULL) {}